

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extr_i64_i32_sparc(TCGContext_conflict7 *tcg_ctx,TCGv_i32 lo,TCGv_i32 hi,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGv_i32 hi_local;
  TCGv_i32 lo_local;
  TCGContext_conflict7 *tcg_ctx_local;
  
  tcg_gen_extrl_i64_i32_sparc(tcg_ctx,lo,arg);
  tcg_gen_extrh_i64_i32_sparc(tcg_ctx,hi,arg);
  return;
}

Assistant:

void tcg_gen_extr_i64_i32(TCGContext *tcg_ctx, TCGv_i32 lo, TCGv_i32 hi, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, lo, TCGV_LOW(tcg_ctx, arg));
        tcg_gen_mov_i32(tcg_ctx, hi, TCGV_HIGH(tcg_ctx, arg));
#else
        tcg_gen_extrl_i64_i32(tcg_ctx, lo, arg);
        tcg_gen_extrh_i64_i32(tcg_ctx, hi, arg);
#endif
}